

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::SubGridIntersector1Pluecker<4,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 *puVar5;
  float *pfVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  ushort uVar10;
  ushort uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  RTCIntersectArguments *pRVar14;
  RTCRayQueryContext *pRVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 (*pauVar34) [16];
  undefined4 uVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  uint uVar44;
  int iVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  byte bVar53;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  float fVar81;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar82;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar83;
  float fVar101;
  float fVar102;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar103;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar111;
  float fVar112;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar145;
  float fVar146;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar147;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar153;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar181 [16];
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar186 [16];
  float fVar190;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar198;
  float fVar199;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13b1;
  undefined1 (*local_13b0) [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_13a4;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  ulong local_1380;
  undefined1 local_1378 [8];
  float fStack_1370;
  float fStack_136c;
  undefined1 local_1368 [8];
  float fStack_1360;
  float fStack_135c;
  undefined1 local_1358 [16];
  RTCFilterFunctionNArguments local_1348;
  undefined1 local_1318 [16];
  float local_1308;
  undefined4 local_1304;
  undefined4 local_1300;
  undefined4 local_12fc;
  float local_12f8;
  undefined4 local_12f4;
  uint local_12f0;
  uint local_12ec;
  uint local_12e8;
  undefined8 local_12d8;
  float fStack_12d0;
  float fStack_12cc;
  undefined1 local_12c8 [8];
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [16];
  undefined1 *local_1288;
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  float local_1248 [4];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined8 local_1168;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined8 local_1138;
  float fStack_1130;
  float fStack_112c;
  undefined4 uStack_1128;
  float fStack_1124;
  ulong local_1120;
  ulong local_1118;
  ulong local_1110;
  ulong local_1108;
  ulong local_1100;
  ulong local_10f8;
  long local_10f0;
  ulong local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  ulong local_10d0;
  ulong local_10c8;
  ulong local_10c0;
  long local_10b8;
  ulong local_10b0;
  ulong local_10a8;
  long local_10a0;
  Scene *local_1098;
  ulong local_1090;
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [8];
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar43 [8];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      local_13b0 = (undefined1 (*) [16])local_f68;
      local_1038 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_11e8 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar154 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar168 = 0.0;
      if (0.0 <= fVar154) {
        fVar168 = fVar154;
      }
      fVar154 = (ray->super_RayK<1>).tfar;
      fVar198 = 0.0;
      if (0.0 <= fVar154) {
        fVar198 = fVar154;
      }
      auVar149._4_4_ = -(uint)(ABS(aVar9.y) < 1e-18);
      auVar149._0_4_ = -(uint)(ABS(aVar9.x) < 1e-18);
      auVar149._8_4_ = -(uint)(ABS(aVar9.z) < 1e-18);
      auVar149._12_4_ = -(uint)(ABS(aVar9.field_3.w) < 1e-18);
      auVar148 = divps(_DAT_01feca10,(undefined1  [16])aVar9);
      auVar149 = blendvps(auVar148,_DAT_0201c930,auVar149);
      fVar154 = auVar149._0_4_ * 0.99999964;
      fVar157 = auVar149._4_4_ * 0.99999964;
      local_1028 = auVar149._8_4_ * 0.99999964;
      local_1058 = auVar149._0_4_ * 1.0000004;
      fVar153 = auVar149._4_4_ * 1.0000004;
      fStack_1010 = auVar149._8_4_ * 1.0000004;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      local_1088._4_4_ = fVar157;
      local_1088._0_4_ = fVar157;
      fStack_1080 = fVar157;
      fStack_107c = fVar157;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      local_1068._4_4_ = fVar153;
      local_1068._0_4_ = fVar153;
      fStack_1060 = fVar153;
      fStack_105c = fVar153;
      local_10c0 = (ulong)(fVar154 < 0.0) << 4;
      local_1018._4_4_ = fStack_1010;
      local_1018._0_4_ = fStack_1010;
      fStack_100c = fStack_1010;
      local_10c8 = (ulong)(fVar157 < 0.0) << 4 | 0x20;
      local_10d0 = (ulong)(local_1028 < 0.0) << 4 | 0x40;
      local_10d8 = local_10c0 ^ 0x10;
      local_1078._4_4_ = fVar168;
      local_1078._0_4_ = fVar168;
      local_1078._8_4_ = fVar168;
      local_1078._12_4_ = fVar168;
      local_11d8._4_4_ = fVar198;
      local_11d8._0_4_ = fVar198;
      fStack_11d0 = fVar198;
      fStack_11cc = fVar198;
      local_10f8 = (ulong)(((uint)(fVar154 < 0.0) << 4) >> 2);
      local_1100 = local_10d8 >> 2;
      local_1108 = local_10c8 >> 2;
      local_10e0 = local_10c8 ^ 0x10;
      local_1110 = (local_10c8 ^ 0x10) >> 2;
      local_1118 = local_10d0 >> 2;
      local_10e8 = local_10d0 ^ 0x10;
      local_1120 = (local_10d0 ^ 0x10) >> 2;
      _local_1008 = mm_lookupmask_ps._240_8_;
      _uStack_1000 = mm_lookupmask_ps._248_8_;
      fStack_11e4 = local_11e8;
      fStack_11e0 = local_11e8;
      fStack_11dc = local_11e8;
      local_13a4._4_8_ = context;
      local_ff8 = fVar154;
      fStack_ff4 = fVar154;
      fStack_ff0 = fVar154;
      fStack_fec = fVar154;
      auVar149 = local_1078;
      fVar168 = fVar154;
      fVar198 = fVar154;
      fVar153 = fVar154;
      auVar148 = _local_1088;
      fVar157 = local_11e8;
      fVar82 = local_11e8;
      fVar103 = local_11e8;
      fVar113 = local_11e8;
      do {
        do {
          do {
            if (local_13b0 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar34 = local_13b0 + -1;
            local_13b0 = local_13b0 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar34 + 8));
          uVar49 = *(ulong *)*local_13b0;
          do {
            if ((uVar49 & 8) == 0) {
              pfVar6 = (float *)(uVar49 + 0x20 + local_10c0);
              auVar54._0_4_ = (*pfVar6 - local_1038) * fVar154;
              auVar54._4_4_ = (pfVar6[1] - fStack_1034) * fVar168;
              auVar54._8_4_ = (pfVar6[2] - fStack_1030) * fVar198;
              auVar54._12_4_ = (pfVar6[3] - fStack_102c) * fVar153;
              pfVar6 = (float *)(uVar49 + 0x20 + local_10c8);
              auVar105._0_4_ = (*pfVar6 - local_1048) * auVar148._0_4_;
              auVar105._4_4_ = (pfVar6[1] - fStack_1044) * auVar148._4_4_;
              auVar105._8_4_ = (pfVar6[2] - fStack_1040) * auVar148._8_4_;
              auVar105._12_4_ = (pfVar6[3] - fStack_103c) * auVar148._12_4_;
              auVar54 = maxps(auVar54,auVar105);
              pfVar6 = (float *)(uVar49 + 0x20 + local_10d0);
              auVar131._0_4_ = (*pfVar6 - fVar157) * local_1028;
              auVar131._4_4_ = (pfVar6[1] - fVar82) * fStack_1024;
              auVar131._8_4_ = (pfVar6[2] - fVar103) * fStack_1020;
              auVar131._12_4_ = (pfVar6[3] - fVar113) * fStack_101c;
              pfVar6 = (float *)(uVar49 + 0x20 + local_10d8);
              auVar139._0_4_ = (*pfVar6 - local_1038) * local_1058;
              auVar139._4_4_ = (pfVar6[1] - fStack_1034) * fStack_1054;
              auVar139._8_4_ = (pfVar6[2] - fStack_1030) * fStack_1050;
              auVar139._12_4_ = (pfVar6[3] - fStack_102c) * fStack_104c;
              pfVar6 = (float *)(uVar49 + 0x20 + local_10e0);
              auVar115._0_4_ = (*pfVar6 - local_1048) * (float)local_1068._0_4_;
              auVar115._4_4_ = (pfVar6[1] - fStack_1044) * (float)local_1068._4_4_;
              auVar115._8_4_ = (pfVar6[2] - fStack_1040) * fStack_1060;
              auVar115._12_4_ = (pfVar6[3] - fStack_103c) * fStack_105c;
              auVar105 = minps(auVar139,auVar115);
              pfVar6 = (float *)(uVar49 + 0x20 + local_10e8);
              auVar116._0_4_ = (*pfVar6 - fVar157) * (float)local_1018._0_4_;
              auVar116._4_4_ = (pfVar6[1] - fVar82) * (float)local_1018._4_4_;
              auVar116._8_4_ = (pfVar6[2] - fVar103) * fStack_1010;
              auVar116._12_4_ = (pfVar6[3] - fVar113) * fStack_100c;
              auVar84 = maxps(auVar131,auVar149);
              _local_12b8 = maxps(auVar54,auVar84);
              auVar54 = minps(auVar116,_local_11d8);
              auVar54 = minps(auVar105,auVar54);
              auVar84._4_4_ = -(uint)(local_12b8._4_4_ <= auVar54._4_4_);
              auVar84._0_4_ = -(uint)(local_12b8._0_4_ <= auVar54._0_4_);
              auVar84._8_4_ = -(uint)(local_12b8._8_4_ <= auVar54._8_4_);
              auVar84._12_4_ = -(uint)(local_12b8._12_4_ <= auVar54._12_4_);
              uVar35 = movmskps((int)local_10e8,auVar84);
              local_10b0 = CONCAT44((int)(local_10e8 >> 0x20),uVar35);
            }
            if ((uVar49 & 8) == 0) {
              if (local_10b0 == 0) {
                iVar45 = 4;
              }
              else {
                uVar48 = uVar49 & 0xfffffffffffffff0;
                lVar38 = 0;
                if (local_10b0 != 0) {
                  for (; (local_10b0 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                  }
                }
                iVar45 = 0;
                uVar49 = *(ulong *)(uVar48 + lVar38 * 8);
                uVar46 = local_10b0 - 1 & local_10b0;
                if (uVar46 != 0) {
                  uVar36 = *(uint *)(local_12b8 + lVar38 * 4);
                  lVar38 = 0;
                  if (uVar46 != 0) {
                    for (; (uVar46 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                    }
                  }
                  uVar47 = *(ulong *)(uVar48 + lVar38 * 8);
                  uVar37 = *(uint *)(local_12b8 + lVar38 * 4);
                  uVar46 = uVar46 - 1 & uVar46;
                  if (uVar46 == 0) {
                    if (uVar36 < uVar37) {
                      *(ulong *)*local_13b0 = uVar47;
                      *(uint *)((long)*local_13b0 + 8) = uVar37;
                      local_13b0 = local_13b0 + 1;
                    }
                    else {
                      *(ulong *)*local_13b0 = uVar49;
                      *(uint *)((long)*local_13b0 + 8) = uVar36;
                      uVar49 = uVar47;
                      local_13b0 = local_13b0 + 1;
                    }
                  }
                  else {
                    auVar85._8_4_ = uVar36;
                    auVar85._0_8_ = uVar49;
                    auVar85._12_4_ = 0;
                    auVar128._8_4_ = uVar37;
                    auVar128._0_8_ = uVar47;
                    auVar128._12_4_ = 0;
                    lVar38 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                      }
                    }
                    uVar7 = *(undefined8 *)(uVar48 + lVar38 * 8);
                    iVar42 = *(int *)(local_12b8 + lVar38 * 4);
                    auVar106._8_4_ = iVar42;
                    auVar106._0_8_ = uVar7;
                    auVar106._12_4_ = 0;
                    auVar55._8_4_ = -(uint)((int)uVar36 < (int)uVar37);
                    uVar46 = uVar46 - 1 & uVar46;
                    if (uVar46 == 0) {
                      auVar55._4_4_ = auVar55._8_4_;
                      auVar55._0_4_ = auVar55._8_4_;
                      auVar55._12_4_ = auVar55._8_4_;
                      auVar117._8_4_ = uVar37;
                      auVar117._0_8_ = uVar47;
                      auVar117._12_4_ = 0;
                      auVar84 = blendvps(auVar117,auVar85,auVar55);
                      auVar54 = blendvps(auVar85,auVar128,auVar55);
                      auVar56._8_4_ = -(uint)(auVar84._8_4_ < iVar42);
                      auVar56._4_4_ = auVar56._8_4_;
                      auVar56._0_4_ = auVar56._8_4_;
                      auVar56._12_4_ = auVar56._8_4_;
                      auVar129._8_4_ = iVar42;
                      auVar129._0_8_ = uVar7;
                      auVar129._12_4_ = 0;
                      auVar131 = blendvps(auVar129,auVar84,auVar56);
                      auVar105 = blendvps(auVar84,auVar106,auVar56);
                      auVar57._8_4_ = -(uint)(auVar54._8_4_ < auVar105._8_4_);
                      auVar57._4_4_ = auVar57._8_4_;
                      auVar57._0_4_ = auVar57._8_4_;
                      auVar57._12_4_ = auVar57._8_4_;
                      auVar84 = blendvps(auVar105,auVar54,auVar57);
                      auVar54 = blendvps(auVar54,auVar105,auVar57);
                      *local_13b0 = auVar54;
                      local_13b0[1] = auVar84;
                      uVar49 = auVar131._0_8_;
                      local_13b0 = local_13b0 + 2;
                    }
                    else {
                      lVar38 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                        }
                      }
                      auVar58._4_4_ = auVar55._8_4_;
                      auVar58._0_4_ = auVar55._8_4_;
                      auVar58._8_4_ = auVar55._8_4_;
                      auVar58._12_4_ = auVar55._8_4_;
                      auVar105 = blendvps(auVar128,auVar85,auVar58);
                      auVar54 = blendvps(auVar85,auVar128,auVar58);
                      auVar137._8_4_ = *(int *)(local_12b8 + lVar38 * 4);
                      auVar137._0_8_ = *(undefined8 *)(uVar48 + lVar38 * 8);
                      auVar137._12_4_ = 0;
                      auVar59._8_4_ = -(uint)(iVar42 < *(int *)(local_12b8 + lVar38 * 4));
                      auVar59._4_4_ = auVar59._8_4_;
                      auVar59._0_4_ = auVar59._8_4_;
                      auVar59._12_4_ = auVar59._8_4_;
                      auVar131 = blendvps(auVar137,auVar106,auVar59);
                      auVar84 = blendvps(auVar106,auVar137,auVar59);
                      auVar60._8_4_ = -(uint)(auVar54._8_4_ < auVar84._8_4_);
                      auVar60._4_4_ = auVar60._8_4_;
                      auVar60._0_4_ = auVar60._8_4_;
                      auVar60._12_4_ = auVar60._8_4_;
                      auVar139 = blendvps(auVar84,auVar54,auVar60);
                      auVar54 = blendvps(auVar54,auVar84,auVar60);
                      auVar61._8_4_ = -(uint)(auVar105._8_4_ < auVar131._8_4_);
                      auVar61._4_4_ = auVar61._8_4_;
                      auVar61._0_4_ = auVar61._8_4_;
                      auVar61._12_4_ = auVar61._8_4_;
                      auVar84 = blendvps(auVar131,auVar105,auVar61);
                      auVar105 = blendvps(auVar105,auVar131,auVar61);
                      auVar62._8_4_ = -(uint)(auVar105._8_4_ < auVar139._8_4_);
                      auVar62._4_4_ = auVar62._8_4_;
                      auVar62._0_4_ = auVar62._8_4_;
                      auVar62._12_4_ = auVar62._8_4_;
                      auVar131 = blendvps(auVar139,auVar105,auVar62);
                      auVar105 = blendvps(auVar105,auVar139,auVar62);
                      *local_13b0 = auVar54;
                      local_13b0[1] = auVar105;
                      local_13b0[2] = auVar131;
                      uVar49 = auVar84._0_8_;
                      fVar157 = local_11e8;
                      fVar82 = fStack_11e4;
                      fVar103 = fStack_11e0;
                      fVar113 = fStack_11dc;
                      local_13b0 = local_13b0 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar45 = 6;
            }
          } while (iVar45 == 0);
        } while (iVar45 != 6);
        local_10f0 = (ulong)((uint)uVar49 & 0xf) - 8;
        if (local_10f0 != 0) {
          uVar49 = uVar49 & 0xfffffffffffffff0;
          local_10b8 = 0;
          local_10a8 = uVar49;
          do {
            lVar38 = local_10b8 * 0x58;
            local_10a0 = uVar49 + lVar38;
            uVar7 = *(undefined8 *)(uVar49 + 0x20 + lVar38);
            uVar8 = *(undefined8 *)(uVar49 + 0x24 + lVar38);
            bVar16 = (byte)uVar7;
            bVar53 = (byte)uVar8;
            bVar17 = (byte)((ulong)uVar7 >> 8);
            bVar75 = (byte)((ulong)uVar8 >> 8);
            bVar18 = (byte)((ulong)uVar7 >> 0x10);
            bVar76 = (byte)((ulong)uVar8 >> 0x10);
            bVar19 = (byte)((ulong)uVar7 >> 0x18);
            bVar77 = (byte)((ulong)uVar8 >> 0x18);
            bVar20 = (byte)((ulong)uVar7 >> 0x20);
            bVar78 = (byte)((ulong)uVar8 >> 0x20);
            bVar21 = (byte)((ulong)uVar7 >> 0x28);
            bVar79 = (byte)((ulong)uVar8 >> 0x28);
            bVar22 = (byte)((ulong)uVar7 >> 0x30);
            bVar80 = (byte)((ulong)uVar8 >> 0x30);
            bVar29 = (byte)((ulong)uVar8 >> 0x38);
            bVar23 = (byte)((ulong)uVar7 >> 0x38);
            auVar148[0] = -((byte)((bVar16 < bVar53) * bVar16 | (bVar16 >= bVar53) * bVar53) ==
                           bVar16);
            auVar148[1] = -((byte)((bVar17 < bVar75) * bVar17 | (bVar17 >= bVar75) * bVar75) ==
                           bVar17);
            auVar148[2] = -((byte)((bVar18 < bVar76) * bVar18 | (bVar18 >= bVar76) * bVar76) ==
                           bVar18);
            auVar148[3] = -((byte)((bVar19 < bVar77) * bVar19 | (bVar19 >= bVar77) * bVar77) ==
                           bVar19);
            auVar148[4] = -((byte)((bVar20 < bVar78) * bVar20 | (bVar20 >= bVar78) * bVar78) ==
                           bVar20);
            auVar148[5] = -((byte)((bVar21 < bVar79) * bVar21 | (bVar21 >= bVar79) * bVar79) ==
                           bVar21);
            auVar148[6] = -((byte)((bVar22 < bVar80) * bVar22 | (bVar22 >= bVar80) * bVar80) ==
                           bVar22);
            auVar148[7] = -((byte)((bVar23 < bVar29) * bVar23 | (bVar23 >= bVar29) * bVar29) ==
                           bVar23);
            auVar148[8] = 0xff;
            auVar148[9] = 0xff;
            auVar148[10] = 0xff;
            auVar148[0xb] = 0xff;
            auVar148[0xc] = 0xff;
            auVar148[0xd] = 0xff;
            auVar148[0xe] = 0xff;
            auVar148[0xf] = 0xff;
            fVar157 = *(float *)(uVar49 + 0x38 + lVar38);
            fVar82 = *(float *)(uVar49 + 0x3c + lVar38);
            fVar103 = *(float *)(uVar49 + 0x44 + lVar38);
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)(local_10f8 + 0x20 + local_10a0);
            auVar149 = pmovzxbd(auVar86,auVar86);
            auVar107._8_8_ = 0;
            auVar107._0_8_ = *(ulong *)(local_1100 + 0x20 + local_10a0);
            auVar54 = pmovzxbd(auVar107,auVar107);
            fVar113 = *(float *)(uVar49 + 0x48 + lVar38);
            auVar118._8_8_ = 0;
            auVar118._0_8_ = *(ulong *)(local_1108 + 0x20 + local_10a0);
            auVar84 = pmovzxbd(auVar118,auVar118);
            auVar119._8_8_ = 0;
            auVar119._0_8_ = *(ulong *)(local_1110 + 0x20 + local_10a0);
            auVar105 = pmovzxbd(auVar119,auVar119);
            fVar114 = *(float *)(uVar49 + 0x4c + lVar38);
            auVar130._8_8_ = 0;
            auVar130._0_8_ = *(ulong *)(local_1118 + 0x20 + local_10a0);
            auVar131 = pmovzxbd(auVar130,auVar130);
            auVar138._8_8_ = 0;
            auVar138._0_8_ = *(ulong *)(local_1120 + 0x20 + local_10a0);
            auVar139 = pmovzxbd(auVar138,auVar138);
            fVar81 = *(float *)(uVar49 + 0x40 + lVar38);
            auVar87._0_4_ = (((float)auVar149._0_4_ * fVar103 + fVar157) - local_1038) * fVar154;
            auVar87._4_4_ = (((float)auVar149._4_4_ * fVar103 + fVar157) - fStack_1034) * fVar168;
            auVar87._8_4_ = (((float)auVar149._8_4_ * fVar103 + fVar157) - fStack_1030) * fVar198;
            auVar87._12_4_ = (((float)auVar149._12_4_ * fVar103 + fVar157) - fStack_102c) * fVar153;
            auVar150._0_4_ =
                 (((float)auVar84._0_4_ * fVar113 + fVar82) - local_1048) * (float)local_1088._0_4_;
            auVar150._4_4_ =
                 (((float)auVar84._4_4_ * fVar113 + fVar82) - fStack_1044) * (float)local_1088._4_4_
            ;
            auVar150._8_4_ = (((float)auVar84._8_4_ * fVar113 + fVar82) - fStack_1040) * fStack_1080
            ;
            auVar150._12_4_ =
                 (((float)auVar84._12_4_ * fVar113 + fVar82) - fStack_103c) * fStack_107c;
            auVar149 = maxps(auVar87,auVar150);
            auVar108._0_4_ = (((float)auVar54._0_4_ * fVar103 + fVar157) - local_1038) * local_1058;
            auVar108._4_4_ =
                 (((float)auVar54._4_4_ * fVar103 + fVar157) - fStack_1034) * fStack_1054;
            auVar108._8_4_ =
                 (((float)auVar54._8_4_ * fVar103 + fVar157) - fStack_1030) * fStack_1050;
            auVar108._12_4_ =
                 (((float)auVar54._12_4_ * fVar103 + fVar157) - fStack_102c) * fStack_104c;
            auVar120._0_4_ =
                 (((float)auVar105._0_4_ * fVar113 + fVar82) - local_1048) * (float)local_1068._0_4_
            ;
            auVar120._4_4_ =
                 (((float)auVar105._4_4_ * fVar113 + fVar82) - fStack_1044) *
                 (float)local_1068._4_4_;
            auVar120._8_4_ =
                 (((float)auVar105._8_4_ * fVar113 + fVar82) - fStack_1040) * fStack_1060;
            auVar120._12_4_ =
                 (((float)auVar105._12_4_ * fVar113 + fVar82) - fStack_103c) * fStack_105c;
            auVar54 = minps(auVar108,auVar120);
            auVar132._0_4_ = (((float)auVar131._0_4_ * fVar114 + fVar81) - local_11e8) * local_1028;
            auVar132._4_4_ =
                 (((float)auVar131._4_4_ * fVar114 + fVar81) - fStack_11e4) * fStack_1024;
            auVar132._8_4_ =
                 (((float)auVar131._8_4_ * fVar114 + fVar81) - fStack_11e0) * fStack_1020;
            auVar132._12_4_ =
                 (((float)auVar131._12_4_ * fVar114 + fVar81) - fStack_11dc) * fStack_101c;
            auVar84 = maxps(auVar132,local_1078);
            local_f88 = maxps(auVar149,auVar84);
            auVar140._0_4_ =
                 (((float)auVar139._0_4_ * fVar114 + fVar81) - local_11e8) * (float)local_1018._0_4_
            ;
            auVar140._4_4_ =
                 (((float)auVar139._4_4_ * fVar114 + fVar81) - fStack_11e4) *
                 (float)local_1018._4_4_;
            auVar140._8_4_ =
                 (((float)auVar139._8_4_ * fVar114 + fVar81) - fStack_11e0) * fStack_1010;
            auVar140._12_4_ =
                 (((float)auVar139._12_4_ * fVar114 + fVar81) - fStack_11dc) * fStack_100c;
            auVar149 = minps(auVar140,_local_11d8);
            auVar149 = minps(auVar54,auVar149);
            auVar63._4_4_ = -(uint)(local_f88._4_4_ <= auVar149._4_4_);
            auVar63._0_4_ = -(uint)(local_f88._0_4_ <= auVar149._0_4_);
            auVar63._8_4_ = -(uint)(local_f88._8_4_ <= auVar149._8_4_);
            auVar63._12_4_ = -(uint)(local_f88._12_4_ <= auVar149._12_4_);
            auVar149 = pmovzxbd(auVar148 ^ _DAT_01febe20,auVar148 ^ _DAT_01febe20);
            auVar63 = ~auVar149 & auVar63;
            auVar64._0_4_ = auVar63._0_4_ << 0x1f;
            auVar64._4_4_ = auVar63._4_4_ << 0x1f;
            auVar64._8_4_ = auVar63._8_4_ << 0x1f;
            auVar64._12_4_ = auVar63._12_4_ << 0x1f;
            uVar36 = movmskps((int)lVar38,auVar64);
            if (uVar36 != 0) {
              local_1090 = (ulong)(uVar36 & 0xff);
              do {
                lVar38 = 0;
                if (local_1090 != 0) {
                  for (; (local_1090 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                  }
                }
                fVar154 = (ray->super_RayK<1>).tfar;
                if (*(float *)(local_f88 + lVar38 * 4) <= fVar154) {
                  local_1318 = ZEXT416((uint)fVar154);
                  uVar10 = *(ushort *)(local_10a0 + lVar38 * 8);
                  uVar11 = *(ushort *)(local_10a0 + 2 + lVar38 * 8);
                  uVar36 = *(uint *)(local_10a0 + 0x50);
                  uVar37 = *(uint *)(local_10a0 + 4 + lVar38 * 8);
                  local_1098 = context->scene;
                  pGVar12 = (local_1098->geometries).items[uVar36].ptr;
                  uVar48 = *(ulong *)&pGVar12->field_0x58;
                  lVar38 = *(long *)&pGVar12[1].time_range.upper;
                  local_1380 = (ulong)uVar37;
                  lVar52 = (ulong)uVar37 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  uVar40 = uVar10 & 0x7fff;
                  auVar43 = (undefined1  [8])(ulong)uVar40;
                  uVar44 = uVar11 & 0x7fff;
                  uVar41 = *(uint *)(uVar48 + 4 + lVar52);
                  uVar47 = (ulong)uVar41;
                  uVar46 = (ulong)(uVar41 * uVar44 + *(int *)(uVar48 + lVar52) + uVar40);
                  p_Var13 = pGVar12[1].intersectionFilterN;
                  pfVar6 = (float *)(lVar38 + (long)p_Var13 * uVar46);
                  pfVar1 = (float *)(lVar38 + (uVar46 + 1) * (long)p_Var13);
                  fVar168 = *pfVar1;
                  local_1178 = pfVar1[1];
                  fVar198 = pfVar1[2];
                  pfVar1 = (float *)(lVar38 + (uVar47 + uVar46) * (long)p_Var13);
                  fVar153 = *pfVar1;
                  local_1368._0_4_ = pfVar1[1];
                  local_12c8._0_4_ = pfVar1[2];
                  lVar50 = uVar47 + uVar46 + 1;
                  pfVar1 = (float *)(lVar38 + lVar50 * (long)p_Var13);
                  fVar157 = *pfVar1;
                  local_1148 = pfVar1[1];
                  fStack_1154 = pfVar1[2];
                  uVar49 = (ulong)(-1 < (short)uVar10);
                  pfVar1 = (float *)(lVar38 + (uVar49 + 1 + uVar46) * (long)p_Var13);
                  lVar51 = uVar49 + lVar50;
                  pfVar2 = (float *)(lVar38 + lVar51 * (long)p_Var13);
                  fStack_1144 = pfVar2[1];
                  uVar49 = 0;
                  if (-1 < (short)uVar11) {
                    uVar49 = uVar47;
                  }
                  pfVar3 = (float *)(lVar38 + (uVar47 + uVar46 + uVar49) * (long)p_Var13);
                  pfVar4 = (float *)(lVar38 + (lVar50 + uVar49) * (long)p_Var13);
                  fStack_113c = pfVar4[1];
                  puVar5 = (undefined4 *)(lVar38 + (uVar49 + lVar51) * (long)p_Var13);
                  local_1138 = CONCAT44(*pfVar2,fVar157);
                  uStack_1128 = *puVar5;
                  fStack_1124 = *pfVar4;
                  fStack_1140 = (float)puVar5[1];
                  fVar82 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar103 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar113 = (ray->super_RayK<1>).org.field_0.m128[2];
                  local_1378._0_4_ = *pfVar6 - fVar82;
                  local_1378._4_4_ = fVar168 - fVar82;
                  fStack_1370 = fVar157 - fVar82;
                  fStack_136c = fVar153 - fVar82;
                  local_1188 = CONCAT44(*pfVar1,fVar168);
                  fVar168 = fVar168 - fVar82;
                  fVar173 = *pfVar1 - fVar82;
                  fVar174 = *pfVar2 - fVar82;
                  fVar175 = fVar157 - fVar82;
                  local_12d8 = CONCAT44(fVar157,fVar153);
                  fVar153 = fVar153 - fVar82;
                  fVar157 = fVar157 - fVar82;
                  fVar81 = *pfVar4 - fVar82;
                  fVar82 = *pfVar3 - fVar82;
                  local_11a8 = pfVar6[1] - fVar103;
                  fStack_11a4 = local_1178 - fVar103;
                  fStack_11a0 = local_1148 - fVar103;
                  fStack_119c = (float)local_1368._0_4_ - fVar103;
                  fStack_1174 = pfVar1[1];
                  fStack_1170 = fStack_1144;
                  fStack_116c = local_1148;
                  fVar136 = local_1178 - fVar103;
                  fVar145 = pfVar1[1] - fVar103;
                  fVar146 = fStack_1144 - fVar103;
                  fVar147 = local_1148 - fVar103;
                  local_1368._4_4_ = local_1148;
                  fStack_1360 = fStack_113c;
                  fStack_135c = pfVar3[1];
                  fVar83 = (float)local_1368._0_4_ - fVar103;
                  fVar101 = local_1148 - fVar103;
                  fVar102 = fStack_113c - fVar103;
                  fVar103 = pfVar3[1] - fVar103;
                  local_1198._0_4_ = pfVar6[2] - fVar113;
                  local_1198._4_4_ = fVar198 - fVar113;
                  fStack_1190 = fStack_1154 - fVar113;
                  fStack_118c = (float)local_12c8._0_4_ - fVar113;
                  local_1168 = CONCAT44(pfVar1[2],fVar198);
                  local_1158 = pfVar2[2];
                  fVar198 = fVar198 - fVar113;
                  fVar203 = pfVar1[2] - fVar113;
                  fVar205 = pfVar2[2] - fVar113;
                  fVar206 = fStack_1154 - fVar113;
                  local_12c8._4_4_ = fStack_1154;
                  fStack_12c0 = pfVar4[2];
                  fStack_12bc = pfVar3[2];
                  fVar104 = (float)local_12c8._0_4_ - fVar113;
                  fVar111 = fStack_1154 - fVar113;
                  fVar112 = pfVar4[2] - fVar113;
                  fVar113 = pfVar3[2] - fVar113;
                  fVar155 = fVar83 - local_11a8;
                  fVar158 = fVar101 - fStack_11a4;
                  fVar160 = fVar102 - fStack_11a0;
                  fVar162 = fVar103 - fStack_119c;
                  local_11b8 = fVar104 - (float)local_1198._0_4_;
                  fStack_11b4 = fVar111 - (float)local_1198._4_4_;
                  fStack_11b0 = fVar112 - fStack_1190;
                  fStack_11ac = fVar113 - fStack_118c;
                  local_f98 = fVar153 - (float)local_1378._0_4_;
                  fStack_f94 = fVar157 - (float)local_1378._4_4_;
                  fStack_f90 = fVar81 - fStack_1370;
                  fStack_f8c = fVar82 - fStack_136c;
                  local_11c8 = fVar155;
                  fStack_11c4 = fVar158;
                  fStack_11c0 = fVar160;
                  fStack_11bc = fVar162;
                  fVar114 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  local_13a4.m128[3] = (ray->super_RayK<1>).dir.field_0.m128[1];
                  local_fa8 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  fVar199 = (fVar155 * (fVar104 + (float)local_1198._0_4_) -
                            local_11b8 * (fVar83 + local_11a8)) * fVar114 +
                            (local_11b8 * (fVar153 + (float)local_1378._0_4_) -
                            (fVar104 + (float)local_1198._0_4_) * local_f98) * local_13a4.m128[3] +
                            ((fVar83 + local_11a8) * local_f98 -
                            (fVar153 + (float)local_1378._0_4_) * fVar155) * local_fa8;
                  fVar204 = (fVar158 * (fVar111 + (float)local_1198._4_4_) -
                            fStack_11b4 * (fVar101 + fStack_11a4)) * fVar114 +
                            (fStack_11b4 * (fVar157 + (float)local_1378._4_4_) -
                            (fVar111 + (float)local_1198._4_4_) * fStack_f94) * local_13a4.m128[3] +
                            ((fVar101 + fStack_11a4) * fStack_f94 -
                            (fVar157 + (float)local_1378._4_4_) * fVar158) * local_fa8;
                  local_fb8._0_8_ = CONCAT44(fVar204,fVar199);
                  local_fb8._8_4_ =
                       (fVar160 * (fVar112 + fStack_1190) - fStack_11b0 * (fVar102 + fStack_11a0)) *
                       fVar114 + (fStack_11b0 * (fVar81 + fStack_1370) -
                                 (fVar112 + fStack_1190) * fStack_f90) * local_13a4.m128[3] +
                                 ((fVar102 + fStack_11a0) * fStack_f90 -
                                 (fVar81 + fStack_1370) * fVar160) * local_fa8;
                  local_fb8._12_4_ =
                       (fVar162 * (fVar113 + fStack_118c) - fStack_11ac * (fVar103 + fStack_119c)) *
                       fVar114 + (fStack_11ac * (fVar82 + fStack_136c) -
                                 (fVar113 + fStack_118c) * fStack_f8c) * local_13a4.m128[3] +
                                 ((fVar103 + fStack_119c) * fStack_f8c -
                                 (fVar82 + fStack_136c) * fVar162) * local_fa8;
                  fVar180 = local_11a8 - fVar136;
                  fVar182 = fStack_11a4 - fVar145;
                  fVar183 = fStack_11a0 - fVar146;
                  fVar184 = fStack_119c - fVar147;
                  fVar190 = (float)local_1198._0_4_ - fVar198;
                  fVar195 = (float)local_1198._4_4_ - fVar203;
                  fVar196 = fStack_1190 - fVar205;
                  fVar197 = fStack_118c - fVar206;
                  fVar185 = (float)local_1378._0_4_ - fVar168;
                  fVar187 = (float)local_1378._4_4_ - fVar173;
                  fVar188 = fStack_1370 - fVar174;
                  fVar189 = fStack_136c - fVar175;
                  local_fc8._0_4_ =
                       (fVar180 * ((float)local_1198._0_4_ + fVar198) -
                       fVar190 * (local_11a8 + fVar136)) * fVar114 +
                       (fVar190 * ((float)local_1378._0_4_ + fVar168) -
                       ((float)local_1198._0_4_ + fVar198) * fVar185) * local_13a4.m128[3] +
                       ((local_11a8 + fVar136) * fVar185 -
                       ((float)local_1378._0_4_ + fVar168) * fVar180) * local_fa8;
                  local_fc8._4_4_ =
                       (fVar182 * ((float)local_1198._4_4_ + fVar203) -
                       fVar195 * (fStack_11a4 + fVar145)) * fVar114 +
                       (fVar195 * ((float)local_1378._4_4_ + fVar173) -
                       ((float)local_1198._4_4_ + fVar203) * fVar187) * local_13a4.m128[3] +
                       ((fStack_11a4 + fVar145) * fVar187 -
                       ((float)local_1378._4_4_ + fVar173) * fVar182) * local_fa8;
                  local_fc8._8_4_ =
                       (fVar183 * (fStack_1190 + fVar205) - fVar196 * (fStack_11a0 + fVar146)) *
                       fVar114 + (fVar196 * (fStack_1370 + fVar174) -
                                 (fStack_1190 + fVar205) * fVar188) * local_13a4.m128[3] +
                                 ((fStack_11a0 + fVar146) * fVar188 -
                                 (fStack_1370 + fVar174) * fVar183) * local_fa8;
                  local_fc8._12_4_ =
                       (fVar184 * (fStack_118c + fVar206) - fVar197 * (fStack_119c + fVar147)) *
                       fVar114 + (fVar197 * (fStack_136c + fVar175) -
                                 (fStack_118c + fVar206) * fVar189) * local_13a4.m128[3] +
                                 ((fStack_119c + fVar147) * fVar189 -
                                 (fStack_136c + fVar175) * fVar184) * local_fa8;
                  fVar156 = fVar168 - fVar153;
                  fVar159 = fVar173 - fVar157;
                  fVar161 = fVar174 - fVar81;
                  fVar163 = fVar175 - fVar82;
                  fVar164 = fVar136 - fVar83;
                  fVar165 = fVar145 - fVar101;
                  fVar166 = fVar146 - fVar102;
                  fVar167 = fVar147 - fVar103;
                  fVar176 = fVar198 - fVar104;
                  fVar177 = fVar203 - fVar111;
                  fVar178 = fVar205 - fVar112;
                  fVar179 = fVar206 - fVar113;
                  fStack_fa4 = local_fa8;
                  fStack_fa0 = local_fa8;
                  fStack_f9c = local_fa8;
                  fStack_1394 = local_13a4.m128[3];
                  fStack_1390 = local_13a4.m128[3];
                  fStack_138c = local_13a4.m128[3];
                  fVar168 = (fVar164 * (fVar104 + fVar198) - fVar176 * (fVar83 + fVar136)) * fVar114
                            + (fVar176 * (fVar153 + fVar168) - (fVar104 + fVar198) * fVar156) *
                              local_13a4.m128[3] +
                              ((fVar83 + fVar136) * fVar156 - (fVar153 + fVar168) * fVar164) *
                              local_fa8;
                  fVar198 = (fVar165 * (fVar111 + fVar203) - fVar177 * (fVar101 + fVar145)) *
                            fVar114 + (fVar177 * (fVar157 + fVar173) - (fVar111 + fVar203) * fVar159
                                      ) * local_13a4.m128[3] +
                                      ((fVar101 + fVar145) * fVar159 - (fVar157 + fVar173) * fVar165
                                      ) * local_fa8;
                  fVar153 = (fVar166 * (fVar112 + fVar205) - fVar178 * (fVar102 + fVar146)) *
                            fVar114 + (fVar178 * (fVar81 + fVar174) - (fVar112 + fVar205) * fVar161)
                                      * local_13a4.m128[3] +
                                      ((fVar102 + fVar146) * fVar161 - (fVar81 + fVar174) * fVar166)
                                      * local_fa8;
                  fVar157 = (fVar167 * (fVar113 + fVar206) - fVar179 * (fVar103 + fVar147)) *
                            fVar114 + (fVar179 * (fVar82 + fVar175) - (fVar113 + fVar206) * fVar163)
                                      * local_13a4.m128[3] +
                                      ((fVar103 + fVar147) * fVar163 - (fVar82 + fVar175) * fVar167)
                                      * local_fa8;
                  fVar82 = fVar199 + local_fc8._0_4_ + fVar168;
                  fVar103 = fVar204 + local_fc8._4_4_ + fVar198;
                  fVar113 = local_fb8._8_4_ + local_fc8._8_4_ + fVar153;
                  fVar81 = local_fb8._12_4_ + local_fc8._12_4_ + fVar157;
                  auVar65._8_4_ = local_fb8._8_4_;
                  auVar65._0_8_ = local_fb8._0_8_;
                  auVar65._12_4_ = local_fb8._12_4_;
                  auVar149 = minps(auVar65,local_fc8);
                  auVar26._4_4_ = fVar198;
                  auVar26._0_4_ = fVar168;
                  auVar26._8_4_ = fVar153;
                  auVar26._12_4_ = fVar157;
                  auVar149 = minps(auVar149,auVar26);
                  auVar141._8_4_ = local_fb8._8_4_;
                  auVar141._0_8_ = local_fb8._0_8_;
                  auVar141._12_4_ = local_fb8._12_4_;
                  auVar148 = maxps(auVar141,local_fc8);
                  auVar27._4_4_ = fVar198;
                  auVar27._0_4_ = fVar168;
                  auVar27._8_4_ = fVar153;
                  auVar27._12_4_ = fVar157;
                  auVar148 = maxps(auVar148,auVar27);
                  local_fe8 = ABS(fVar82);
                  fStack_fe4 = ABS(fVar103);
                  fStack_fe0 = ABS(fVar113);
                  fStack_fdc = ABS(fVar81);
                  local_1288 = &local_13b1;
                  auVar142._0_4_ =
                       -(uint)(auVar148._0_4_ <= local_fe8 * 1.1920929e-07 ||
                              -(local_fe8 * 1.1920929e-07) <= auVar149._0_4_) & local_1008;
                  auVar142._4_4_ =
                       -(uint)(auVar148._4_4_ <= fStack_fe4 * 1.1920929e-07 ||
                              -(fStack_fe4 * 1.1920929e-07) <= auVar149._4_4_) & uStack_1004;
                  auVar142._8_4_ =
                       -(uint)(auVar148._8_4_ <= fStack_fe0 * 1.1920929e-07 ||
                              -(fStack_fe0 * 1.1920929e-07) <= auVar149._8_4_) & uStack_1000;
                  auVar142._12_4_ =
                       -(uint)(auVar148._12_4_ <= fStack_fdc * 1.1920929e-07 ||
                              -(fStack_fdc * 1.1920929e-07) <= auVar149._12_4_) & uStack_ffc;
                  iVar45 = movmskps((int)lVar38,auVar142);
                  local_11f8 = ZEXT416(uVar40);
                  local_1208 = ZEXT416(uVar44);
                  uVar49 = uVar48;
                  context = (RayQueryContext *)local_13a4._4_8_;
                  if (iVar45 != 0) {
                    local_fd8 = fVar82;
                    fStack_fd4 = fVar103;
                    fStack_fd0 = fVar113;
                    fStack_fcc = fVar81;
                    auVar151._0_4_ = fVar155 * fVar190 - local_11b8 * fVar180;
                    auVar151._4_4_ = fVar158 * fVar195 - fStack_11b4 * fVar182;
                    auVar151._8_4_ = fVar160 * fVar196 - fStack_11b0 * fVar183;
                    auVar151._12_4_ = fVar162 * fVar197 - fStack_11ac * fVar184;
                    auVar133._0_4_ = fVar180 * fVar176 - fVar190 * fVar164;
                    auVar133._4_4_ = fVar182 * fVar177 - fVar195 * fVar165;
                    auVar133._8_4_ = fVar183 * fVar178 - fVar196 * fVar166;
                    auVar133._12_4_ = fVar184 * fVar179 - fVar197 * fVar167;
                    local_11c8 = fVar164;
                    fStack_11c4 = fVar165;
                    fStack_11c0 = fVar166;
                    fStack_11bc = fVar167;
                    auVar66._4_4_ = -(uint)(ABS(fStack_11b4 * fVar182) < ABS(fVar195 * fVar165));
                    auVar66._0_4_ = -(uint)(ABS(local_11b8 * fVar180) < ABS(fVar190 * fVar164));
                    auVar66._8_4_ = -(uint)(ABS(fStack_11b0 * fVar183) < ABS(fVar196 * fVar166));
                    auVar66._12_4_ = -(uint)(ABS(fStack_11ac * fVar184) < ABS(fVar197 * fVar167));
                    local_1298._4_4_ = fVar103;
                    local_1298._0_4_ = fVar82;
                    local_1298._8_4_ = fVar113;
                    local_1298._12_4_ = fVar81;
                    local_1238 = blendvps(auVar133,auVar151,auVar66);
                    auVar200._0_4_ = local_11b8 * fVar185 - local_f98 * fVar190;
                    auVar200._4_4_ = fStack_11b4 * fVar187 - fStack_f94 * fVar195;
                    auVar200._8_4_ = fStack_11b0 * fVar188 - fStack_f90 * fVar196;
                    auVar200._12_4_ = fStack_11ac * fVar189 - fStack_f8c * fVar197;
                    auVar191._0_4_ = fVar190 * fVar156 - fVar185 * fVar176;
                    auVar191._4_4_ = fVar195 * fVar159 - fVar187 * fVar177;
                    auVar191._8_4_ = fVar196 * fVar161 - fVar188 * fVar178;
                    auVar191._12_4_ = fVar197 * fVar163 - fVar189 * fVar179;
                    auVar67._4_4_ = -(uint)(ABS(fStack_f94 * fVar195) < ABS(fVar187 * fVar177));
                    auVar67._0_4_ = -(uint)(ABS(local_f98 * fVar190) < ABS(fVar185 * fVar176));
                    auVar67._8_4_ = -(uint)(ABS(fStack_f90 * fVar196) < ABS(fVar188 * fVar178));
                    auVar67._12_4_ = -(uint)(ABS(fStack_f8c * fVar197) < ABS(fVar189 * fVar179));
                    local_1228 = blendvps(auVar191,auVar200,auVar67);
                    auVar121._0_4_ = local_f98 * fVar180 - fVar155 * fVar185;
                    auVar121._4_4_ = fStack_f94 * fVar182 - fVar158 * fVar187;
                    auVar121._8_4_ = fStack_f90 * fVar183 - fVar160 * fVar188;
                    auVar121._12_4_ = fStack_f8c * fVar184 - fVar162 * fVar189;
                    auVar186._0_4_ = fVar185 * fVar164 - fVar180 * fVar156;
                    auVar186._4_4_ = fVar187 * fVar165 - fVar182 * fVar159;
                    auVar186._8_4_ = fVar188 * fVar166 - fVar183 * fVar161;
                    auVar186._12_4_ = fVar189 * fVar167 - fVar184 * fVar163;
                    auVar68._4_4_ = -(uint)(ABS(fVar158 * fVar187) < ABS(fVar182 * fVar159));
                    auVar68._0_4_ = -(uint)(ABS(fVar155 * fVar185) < ABS(fVar180 * fVar156));
                    auVar68._8_4_ = -(uint)(ABS(fVar160 * fVar188) < ABS(fVar183 * fVar161));
                    auVar68._12_4_ = -(uint)(ABS(fVar162 * fVar189) < ABS(fVar184 * fVar163));
                    local_1218 = blendvps(auVar186,auVar121,auVar68);
                    fVar168 = fVar114 * local_1238._0_4_ +
                              local_13a4.m128[3] * local_1228._0_4_ + local_fa8 * local_1218._0_4_;
                    fVar198 = fVar114 * local_1238._4_4_ +
                              local_13a4.m128[3] * local_1228._4_4_ + local_fa8 * local_1218._4_4_;
                    fVar153 = fVar114 * local_1238._8_4_ +
                              local_13a4.m128[3] * local_1228._8_4_ + local_fa8 * local_1218._8_4_;
                    fVar157 = fVar114 * local_1238._12_4_ +
                              local_13a4.m128[3] * local_1228._12_4_ + local_fa8 * local_1218._12_4_
                    ;
                    auVar169._0_4_ = fVar168 + fVar168;
                    auVar169._4_4_ = fVar198 + fVar198;
                    auVar169._8_4_ = fVar153 + fVar153;
                    auVar169._12_4_ = fVar157 + fVar157;
                    auVar88._0_4_ =
                         local_11a8 * local_1228._0_4_ + (float)local_1198._0_4_ * local_1218._0_4_;
                    auVar88._4_4_ =
                         fStack_11a4 * local_1228._4_4_ + (float)local_1198._4_4_ * local_1218._4_4_
                    ;
                    auVar88._8_4_ = fStack_11a0 * local_1228._8_4_ + fStack_1190 * local_1218._8_4_;
                    auVar88._12_4_ =
                         fStack_119c * local_1228._12_4_ + fStack_118c * local_1218._12_4_;
                    fVar114 = (float)local_1378._0_4_ * local_1238._0_4_ + auVar88._0_4_;
                    fVar83 = (float)local_1378._4_4_ * local_1238._4_4_ + auVar88._4_4_;
                    fVar101 = fStack_1370 * local_1238._8_4_ + auVar88._8_4_;
                    fVar102 = fStack_136c * local_1238._12_4_ + auVar88._12_4_;
                    auVar149 = rcpps(auVar88,auVar169);
                    fVar168 = auVar149._0_4_;
                    fVar198 = auVar149._4_4_;
                    fVar153 = auVar149._8_4_;
                    fVar157 = auVar149._12_4_;
                    local_1248[0] =
                         ((1.0 - auVar169._0_4_ * fVar168) * fVar168 + fVar168) *
                         (fVar114 + fVar114);
                    local_1248[1] =
                         ((1.0 - auVar169._4_4_ * fVar198) * fVar198 + fVar198) * (fVar83 + fVar83);
                    local_1248[2] =
                         ((1.0 - auVar169._8_4_ * fVar153) * fVar153 + fVar153) *
                         (fVar101 + fVar101);
                    local_1248[3] =
                         ((1.0 - auVar169._12_4_ * fVar157) * fVar157 + fVar157) *
                         (fVar102 + fVar102);
                    fVar168 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar170._0_4_ =
                         (int)((uint)((local_1248[0] <= fVar154 && fVar168 <= local_1248[0]) &&
                                     auVar169._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar170._4_4_ =
                         (int)((uint)((local_1248[1] <= fVar154 && fVar168 <= local_1248[1]) &&
                                     auVar169._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar170._8_4_ =
                         (int)((uint)((local_1248[2] <= fVar154 && fVar168 <= local_1248[2]) &&
                                     auVar169._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar170._12_4_ =
                         (int)((uint)((local_1248[3] <= fVar154 && fVar168 <= local_1248[3]) &&
                                     auVar169._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar171 = auVar170 & auVar142;
                    uVar41 = movmskps(uVar40,auVar171);
                    auVar43 = (undefined1  [8])(ulong)uVar41;
                    if (uVar41 != 0) {
                      local_1278 = auVar171;
                      fVar154 = (float)(int)(*(ushort *)(uVar48 + 8 + lVar52) - 1);
                      auVar149 = rcpss(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
                      uVar41 = *(ushort *)(uVar48 + 10 + lVar52) - 1;
                      auVar43 = (undefined1  [8])(ulong)uVar41;
                      auVar143._4_12_ = auVar142._4_12_;
                      auVar143._0_4_ = (float)(int)uVar41;
                      fVar154 = (2.0 - fVar154 * auVar149._0_4_) * auVar149._0_4_;
                      auVar134._4_4_ = auVar142._4_4_;
                      auVar134._0_4_ = auVar143._0_4_;
                      auVar134._8_4_ = auVar142._8_4_;
                      auVar134._12_4_ = auVar142._12_4_;
                      auVar149 = rcpss(auVar134,auVar143);
                      fStack_129c = (2.0 - auVar143._0_4_ * auVar149._0_4_) * auVar149._0_4_;
                      auVar122._0_4_ = (float)uVar40 * fVar82 + fVar199;
                      auVar122._4_4_ = (float)(uVar40 + 1) * fVar103 + fVar204;
                      auVar122._8_4_ = (float)(uVar40 + 1) * fVar113 + local_fb8._8_4_;
                      auVar122._12_4_ = (float)uVar40 * fVar81 + local_fb8._12_4_;
                      local_12b8._4_4_ = fVar154 * auVar122._4_4_;
                      local_12b8._0_4_ = fVar154 * auVar122._0_4_;
                      fStack_12b0 = fVar154 * auVar122._8_4_;
                      fStack_12ac = fVar154 * auVar122._12_4_;
                      local_12a8._0_4_ = fStack_129c * ((float)uVar44 * fVar82 + local_fc8._0_4_);
                      local_12a8._4_4_ = fStack_129c * ((float)uVar44 * fVar103 + local_fc8._4_4_);
                      fStack_12a0 = fStack_129c * ((float)(uVar44 + 1) * fVar113 + local_fc8._8_4_);
                      fStack_129c = fStack_129c * ((float)(uVar44 + 1) * fVar81 + local_fc8._12_4_);
                      pGVar12 = (local_1098->geometries).items[uVar36].ptr;
                      uVar41 = (ray->super_RayK<1>).mask;
                      uVar49 = (ulong)uVar41;
                      if ((pGVar12->mask & uVar41) != 0) {
                        auVar149 = rcpps(auVar122,local_1298);
                        fVar168 = auVar149._0_4_;
                        fVar198 = auVar149._4_4_;
                        fVar153 = auVar149._8_4_;
                        fVar157 = auVar149._12_4_;
                        fVar168 = (float)(-(uint)(1e-18 <= local_fe8) &
                                         (uint)(((float)DAT_01feca10 - fVar82 * fVar168) * fVar168 +
                                               fVar168));
                        fVar198 = (float)(-(uint)(1e-18 <= fStack_fe4) &
                                         (uint)((DAT_01feca10._4_4_ - fVar103 * fVar198) * fVar198 +
                                               fVar198));
                        fVar153 = (float)(-(uint)(1e-18 <= fStack_fe0) &
                                         (uint)((DAT_01feca10._8_4_ - fVar113 * fVar153) * fVar153 +
                                               fVar153));
                        fVar157 = (float)(-(uint)(1e-18 <= fStack_fdc) &
                                         (uint)((DAT_01feca10._12_4_ - fVar81 * fVar157) * fVar157 +
                                               fVar157));
                        auVar89._0_4_ = fVar154 * auVar122._0_4_ * fVar168;
                        auVar89._4_4_ = fVar154 * auVar122._4_4_ * fVar198;
                        auVar89._8_4_ = fVar154 * auVar122._8_4_ * fVar153;
                        auVar89._12_4_ = fVar154 * auVar122._12_4_ * fVar157;
                        local_1268 = minps(auVar89,_DAT_01feca10);
                        auVar109._0_4_ = (float)local_12a8._0_4_ * fVar168;
                        auVar109._4_4_ = (float)local_12a8._4_4_ * fVar198;
                        auVar109._8_4_ = fStack_12a0 * fVar153;
                        auVar109._12_4_ = fStack_129c * fVar157;
                        local_1258 = minps(auVar109,_DAT_01feca10);
                        auVar30._4_4_ = local_1248[1];
                        auVar30._0_4_ = local_1248[0];
                        auVar30._8_4_ = local_1248[2];
                        auVar30._12_4_ = local_1248[3];
                        auVar148 = blendvps(_DAT_01feb9f0,auVar30,auVar171);
                        local_1358 = auVar171;
                        auVar123._4_4_ = auVar148._0_4_;
                        auVar123._0_4_ = auVar148._4_4_;
                        auVar123._8_4_ = auVar148._12_4_;
                        auVar123._12_4_ = auVar148._8_4_;
                        auVar149 = minps(auVar123,auVar148);
                        auVar90._0_8_ = auVar149._8_8_;
                        auVar90._8_4_ = auVar149._0_4_;
                        auVar90._12_4_ = auVar149._4_4_;
                        auVar149 = minps(auVar90,auVar149);
                        auVar91._0_8_ =
                             CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) & auVar171._4_4_,
                                      -(uint)(auVar149._0_4_ == auVar148._0_4_) & auVar171._0_4_);
                        auVar91._8_4_ = -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar171._8_4_;
                        auVar91._12_4_ =
                             -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar171._12_4_;
                        iVar45 = movmskps(uVar41,auVar91);
                        if (iVar45 != 0) {
                          auVar171._8_4_ = auVar91._8_4_;
                          auVar171._0_8_ = auVar91._0_8_;
                          auVar171._12_4_ = auVar91._12_4_;
                        }
                        uVar41 = movmskps(iVar45,auVar171);
                        lVar38 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                          }
                        }
                        pRVar14 = *(RTCIntersectArguments **)(local_13a4._4_8_ + 0x10);
                        if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar157 = *(float *)(local_1268 + lVar38 * 4);
                          fVar154 = local_1248[lVar38 + -4];
                          fVar168 = *(float *)(local_1238 + lVar38 * 4);
                          fVar198 = *(float *)(local_1228 + lVar38 * 4);
                          fVar153 = *(float *)(local_1218 + lVar38 * 4);
                          (ray->super_RayK<1>).tfar = local_1248[lVar38];
                          (ray->Ng).field_0.field_0.x = fVar168;
                          (ray->Ng).field_0.field_0.y = fVar198;
                          (ray->Ng).field_0.field_0.z = fVar153;
                          ray->u = fVar157;
                          ray->v = fVar154;
                          ray->primID = uVar37;
                          ray->geomID = uVar36;
                          pRVar15 = *(RTCRayQueryContext **)(local_13a4._4_8_ + 8);
                          uVar37 = pRVar15->instID[0];
                          auVar43 = (undefined1  [8])(ulong)uVar37;
                          ray->instID[0] = uVar37;
                          uVar37 = pRVar15->instPrimID[0];
                          uVar49 = (ulong)uVar37;
                          ray->instPrimID[0] = uVar37;
                        }
                        else {
                          local_1378 = (undefined1  [8])
                                       *(RTCRayQueryContext **)(local_13a4._4_8_ + 8);
                          local_1318._8_8_ = 0;
                          local_1318._0_8_ = uVar48;
                          do {
                            local_12fc = *(undefined4 *)(local_1268 + lVar38 * 4);
                            local_12f8 = local_1248[lVar38 + -4];
                            local_13a4.m128[3] = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1248[lVar38];
                            local_1308 = *(float *)(local_1238 + lVar38 * 4);
                            local_1304 = *(undefined4 *)(local_1228 + lVar38 * 4);
                            local_1300 = *(undefined4 *)(local_1218 + lVar38 * 4);
                            local_12f4 = (int)local_1380;
                            local_12f0 = uVar36;
                            local_12ec = *(uint *)local_1378;
                            local_12e8 = *(uint *)((long)local_1378 + 4);
                            local_13a4.m128[0] = -NAN;
                            local_1348.valid = (int *)&local_13a4;
                            local_1348.geometryUserPtr = pGVar12->userPtr;
                            local_1348.context = (RTCRayQueryContext *)local_1378;
                            local_1348.ray = (RTCRayN *)ray;
                            local_1348.hit = (RTCHitN *)&local_1308;
                            local_1348.N = 1;
                            auVar43 = local_1378;
                            if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e97261:
                              if (pRVar14->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar14->filter)(&local_1348);
                                  uVar48 = local_1318._0_8_;
                                  context = (RayQueryContext *)local_13a4._4_8_;
                                }
                                if (*(float *)local_1348.valid == 0.0) goto LAB_00e972fb;
                              }
                              *(float *)((long)local_1348.ray + 0x30) = *(float *)local_1348.hit;
                              *(float *)((long)local_1348.ray + 0x34) =
                                   *(float *)(local_1348.hit + 4);
                              *(float *)((long)local_1348.ray + 0x38) =
                                   *(float *)(local_1348.hit + 8);
                              *(float *)((long)local_1348.ray + 0x3c) =
                                   *(float *)(local_1348.hit + 0xc);
                              *(float *)((long)local_1348.ray + 0x40) =
                                   *(float *)(local_1348.hit + 0x10);
                              *(float *)((long)local_1348.ray + 0x44) =
                                   *(float *)(local_1348.hit + 0x14);
                              *(float *)((long)local_1348.ray + 0x48) =
                                   *(float *)(local_1348.hit + 0x18);
                              *(float *)((long)local_1348.ray + 0x4c) =
                                   *(float *)(local_1348.hit + 0x1c);
                              auVar43 = (undefined1  [8])
                                        (ulong)(uint)*(float *)(local_1348.hit + 0x20);
                              *(float *)((long)local_1348.ray + 0x50) =
                                   *(float *)(local_1348.hit + 0x20);
                              paVar39 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.ray;
                            }
                            else {
                              (*pGVar12->intersectionFilterN)(&local_1348);
                              uVar48 = local_1318._0_8_;
                              context = (RayQueryContext *)local_13a4._4_8_;
                              if (*(float *)local_1348.valid != 0.0) goto LAB_00e97261;
LAB_00e972fb:
                              (ray->super_RayK<1>).tfar = local_13a4.m128[3];
                              paVar39 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.valid;
                            }
                            *(undefined4 *)(local_1358 + lVar38 * 4) = 0;
                            fVar154 = (ray->super_RayK<1>).tfar;
                            auVar32._4_4_ = local_1248[1];
                            auVar32._0_4_ = local_1248[0];
                            auVar32._8_4_ = local_1248[2];
                            auVar32._12_4_ = local_1248[3];
                            auVar73._0_4_ = -(uint)(local_1248[0] <= fVar154) & local_1358._0_4_;
                            auVar73._4_4_ = -(uint)(local_1248[1] <= fVar154) & local_1358._4_4_;
                            auVar73._8_4_ = -(uint)(local_1248[2] <= fVar154) & local_1358._8_4_;
                            auVar73._12_4_ = -(uint)(local_1248[3] <= fVar154) & local_1358._12_4_;
                            local_1358 = auVar73;
                            uVar37 = movmskps((int)paVar39,auVar73);
                            uVar49 = (ulong)uVar37;
                            if (uVar37 != 0) {
                              auVar148 = blendvps(_DAT_01feb9f0,auVar32,auVar73);
                              auVar126._4_4_ = auVar148._0_4_;
                              auVar126._0_4_ = auVar148._4_4_;
                              auVar126._8_4_ = auVar148._12_4_;
                              auVar126._12_4_ = auVar148._8_4_;
                              auVar149 = minps(auVar126,auVar148);
                              auVar97._0_8_ = auVar149._8_8_;
                              auVar97._8_4_ = auVar149._0_4_;
                              auVar97._12_4_ = auVar149._4_4_;
                              auVar149 = minps(auVar97,auVar149);
                              auVar98._0_8_ =
                                   CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) &
                                            auVar73._4_4_,
                                            -(uint)(auVar149._0_4_ == auVar148._0_4_) &
                                            auVar73._0_4_);
                              auVar98._8_4_ =
                                   -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar73._8_4_;
                              auVar98._12_4_ =
                                   -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar73._12_4_;
                              iVar45 = movmskps(SUB84(auVar43,0),auVar98);
                              if (iVar45 != 0) {
                                auVar73._8_4_ = auVar98._8_4_;
                                auVar73._0_8_ = auVar98._0_8_;
                                auVar73._12_4_ = auVar98._12_4_;
                              }
                              uVar35 = movmskps(iVar45,auVar73);
                              auVar43 = (undefined1  [8])
                                        CONCAT44((int)((ulong)auVar43 >> 0x20),uVar35);
                              lVar38 = 0;
                              if (auVar43 != (undefined1  [8])0x0) {
                                for (; ((ulong)auVar43 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                                }
                              }
                            }
                          } while ((char)uVar37 != '\0');
                        }
                      }
                    }
                  }
                  fVar154 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar168 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar198 = (ray->super_RayK<1>).org.field_0.m128[2];
                  fVar153 = (ray->super_RayK<1>).dir.field_0.m128[0];
                  fVar157 = (ray->super_RayK<1>).dir.field_0.m128[1];
                  local_13a4.m128[3] = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1138._0_4_ = (float)local_1138 - fVar154;
                  local_1138._4_4_ = local_1138._4_4_ - fVar154;
                  fStack_1130 = fStack_1130 - fVar154;
                  fStack_112c = fStack_112c - fVar154;
                  local_1148 = local_1148 - fVar168;
                  fStack_1144 = fStack_1144 - fVar168;
                  fStack_1140 = fStack_1140 - fVar168;
                  fStack_113c = fStack_113c - fVar168;
                  local_1158 = local_1158 - fVar198;
                  fStack_1154 = fStack_1154 - fVar198;
                  fStack_1150 = fStack_1150 - fVar198;
                  fStack_114c = fStack_114c - fVar198;
                  local_12d8._0_4_ = (float)local_12d8 - fVar154;
                  local_12d8._4_4_ = local_12d8._4_4_ - fVar154;
                  fVar81 = fStack_12d0 - fVar154;
                  fVar102 = fStack_12cc - fVar154;
                  fVar82 = (float)local_1368._0_4_ - fVar168;
                  fVar113 = (float)local_1368._4_4_ - fVar168;
                  fVar83 = fStack_1360 - fVar168;
                  fVar104 = fStack_135c - fVar168;
                  fVar103 = (float)local_12c8._0_4_ - fVar198;
                  fVar114 = (float)local_12c8._4_4_ - fVar198;
                  fVar101 = fStack_12c0 - fVar198;
                  fVar111 = fStack_12bc - fVar198;
                  fVar179 = (float)local_1188 - fVar154;
                  fVar180 = local_1188._4_4_ - fVar154;
                  fVar182 = fStack_1180 - fVar154;
                  fVar154 = fStack_117c - fVar154;
                  fVar183 = local_1178 - fVar168;
                  fVar184 = fStack_1174 - fVar168;
                  fVar185 = fStack_1170 - fVar168;
                  fVar168 = fStack_116c - fVar168;
                  fVar161 = (float)local_1168 - fVar198;
                  fVar162 = local_1168._4_4_ - fVar198;
                  fVar163 = fStack_1160 - fVar198;
                  fVar198 = fStack_115c - fVar198;
                  fVar112 = fVar179 - (float)local_1138;
                  fVar145 = fVar180 - local_1138._4_4_;
                  fVar147 = fVar182 - fStack_1130;
                  fVar156 = fVar154 - fStack_112c;
                  local_1178 = fVar183 - local_1148;
                  fStack_1174 = fVar184 - fStack_1144;
                  fStack_1170 = fVar185 - fStack_1140;
                  fStack_116c = fVar168 - fStack_113c;
                  fVar164 = fVar161 - local_1158;
                  fVar166 = fVar162 - fStack_1154;
                  fStack_1160 = fVar163 - fStack_1150;
                  fStack_115c = fVar198 - fStack_114c;
                  local_1168 = CONCAT44(fVar166,fVar164);
                  local_1368._4_4_ = fVar157;
                  local_1368._0_4_ = fVar157;
                  fStack_1360 = fVar157;
                  fStack_135c = fVar157;
                  fStack_1394 = local_13a4.m128[3];
                  fStack_1390 = local_13a4.m128[3];
                  fStack_138c = local_13a4.m128[3];
                  local_1378._4_4_ = fVar145;
                  local_1378._0_4_ = fVar112;
                  fStack_1370 = fVar147;
                  fStack_136c = fVar156;
                  fVar136 = local_1148 - fVar82;
                  fVar146 = fStack_1144 - fVar113;
                  fVar155 = fStack_1140 - fVar83;
                  fVar158 = fStack_113c - fVar104;
                  fVar175 = local_1158 - fVar103;
                  fVar176 = fStack_1154 - fVar114;
                  fVar177 = fStack_1150 - fVar101;
                  fVar178 = fStack_114c - fVar111;
                  fVar173 = (local_1178 * (fVar161 + local_1158) - fVar164 * (fVar183 + local_1148))
                            * fVar153 +
                            (fVar164 * (fVar179 + (float)local_1138) -
                            (fVar161 + local_1158) * fVar112) * fVar157 +
                            ((fVar183 + local_1148) * fVar112 -
                            (fVar179 + (float)local_1138) * local_1178) * local_13a4.m128[3];
                  fVar174 = (fStack_1174 * (fVar162 + fStack_1154) -
                            fVar166 * (fVar184 + fStack_1144)) * fVar153 +
                            (fVar166 * (fVar180 + local_1138._4_4_) -
                            (fVar162 + fStack_1154) * fVar145) * fVar157 +
                            ((fVar184 + fStack_1144) * fVar145 -
                            (fVar180 + local_1138._4_4_) * fStack_1174) * local_13a4.m128[3];
                  local_12c8 = (undefined1  [8])CONCAT44(fVar174,fVar173);
                  fStack_12c0 = (fStack_1170 * (fVar163 + fStack_1150) -
                                fStack_1160 * (fVar185 + fStack_1140)) * fVar153 +
                                (fStack_1160 * (fVar182 + fStack_1130) -
                                (fVar163 + fStack_1150) * fVar147) * fVar157 +
                                ((fVar185 + fStack_1140) * fVar147 -
                                (fVar182 + fStack_1130) * fStack_1170) * local_13a4.m128[3];
                  fStack_12bc = (fStack_116c * (fVar198 + fStack_114c) -
                                fStack_115c * (fVar168 + fStack_113c)) * fVar153 +
                                (fStack_115c * (fVar154 + fStack_112c) -
                                (fVar198 + fStack_114c) * fVar156) * fVar157 +
                                ((fVar168 + fStack_113c) * fVar156 -
                                (fVar154 + fStack_112c) * fStack_116c) * local_13a4.m128[3];
                  fVar159 = (float)local_1138 - (float)local_12d8;
                  fVar160 = local_1138._4_4_ - local_12d8._4_4_;
                  fStack_1180 = fStack_1130 - fVar81;
                  fStack_117c = fStack_112c - fVar102;
                  local_1188 = CONCAT44(fVar160,fVar159);
                  fVar165 = (fVar136 * (local_1158 + fVar103) - fVar175 * (local_1148 + fVar82)) *
                            fVar153 + (fVar175 * ((float)local_1138 + (float)local_12d8) -
                                      (local_1158 + fVar103) * fVar159) * fVar157 +
                                      ((local_1148 + fVar82) * fVar159 -
                                      ((float)local_1138 + (float)local_12d8) * fVar136) *
                                      local_13a4.m128[3];
                  fVar167 = (fVar146 * (fStack_1154 + fVar114) - fVar176 * (fStack_1144 + fVar113))
                            * fVar153 +
                            (fVar176 * (local_1138._4_4_ + local_12d8._4_4_) -
                            (fStack_1154 + fVar114) * fVar160) * fVar157 +
                            ((fStack_1144 + fVar113) * fVar160 -
                            (local_1138._4_4_ + local_12d8._4_4_) * fVar146) * local_13a4.m128[3];
                  fStack_12d0 = (fVar155 * (fStack_1150 + fVar101) -
                                fVar177 * (fStack_1140 + fVar83)) * fVar153 +
                                (fVar177 * (fStack_1130 + fVar81) -
                                (fStack_1150 + fVar101) * fStack_1180) * fVar157 +
                                ((fStack_1140 + fVar83) * fStack_1180 -
                                (fStack_1130 + fVar81) * fVar155) * local_13a4.m128[3];
                  fStack_12cc = (fVar158 * (fStack_114c + fVar111) -
                                fVar178 * (fStack_113c + fVar104)) * fVar153 +
                                (fVar178 * (fStack_112c + fVar102) -
                                (fStack_114c + fVar111) * fStack_117c) * fVar157 +
                                ((fStack_113c + fVar104) * fStack_117c -
                                (fStack_112c + fVar102) * fVar158) * local_13a4.m128[3];
                  local_1378._0_4_ = (float)local_12d8 - fVar179;
                  local_1378._4_4_ = local_12d8._4_4_ - fVar180;
                  fStack_1370 = fVar81 - fVar182;
                  fStack_136c = fVar102 - fVar154;
                  local_1198._0_4_ = fVar82 - fVar183;
                  local_1198._4_4_ = fVar113 - fVar184;
                  fStack_1190 = fVar83 - fVar185;
                  fStack_118c = fVar104 - fVar168;
                  local_11a8 = fVar103 - fVar161;
                  fStack_11a4 = fVar114 - fVar162;
                  fStack_11a0 = fVar101 - fVar163;
                  fStack_119c = fVar111 - fVar198;
                  auVar69._0_4_ =
                       ((float)local_1198._0_4_ * (fVar161 + fVar103) -
                       local_11a8 * (fVar183 + fVar82)) * fVar153 +
                       (local_11a8 * (fVar179 + (float)local_12d8) -
                       (fVar161 + fVar103) * (float)local_1378._0_4_) * fVar157 +
                       ((fVar183 + fVar82) * (float)local_1378._0_4_ -
                       (fVar179 + (float)local_12d8) * (float)local_1198._0_4_) * local_13a4.m128[3]
                  ;
                  auVar69._4_4_ =
                       ((float)local_1198._4_4_ * (fVar162 + fVar114) -
                       fStack_11a4 * (fVar184 + fVar113)) * fVar153 +
                       (fStack_11a4 * (fVar180 + local_12d8._4_4_) -
                       (fVar162 + fVar114) * (float)local_1378._4_4_) * fVar157 +
                       ((fVar184 + fVar113) * (float)local_1378._4_4_ -
                       (fVar180 + local_12d8._4_4_) * (float)local_1198._4_4_) * local_13a4.m128[3];
                  auVar69._8_4_ =
                       (fStack_1190 * (fVar163 + fVar101) - fStack_11a0 * (fVar185 + fVar83)) *
                       fVar153 + (fStack_11a0 * (fVar182 + fVar81) -
                                 (fVar163 + fVar101) * fStack_1370) * fVar157 +
                                 ((fVar185 + fVar83) * fStack_1370 -
                                 (fVar182 + fVar81) * fStack_1190) * local_13a4.m128[3];
                  auVar69._12_4_ =
                       (fStack_118c * (fVar198 + fVar111) - fStack_119c * (fVar168 + fVar104)) *
                       fVar153 + (fStack_119c * (fVar154 + fVar102) -
                                 (fVar198 + fVar111) * fStack_136c) * fVar157 +
                                 ((fVar168 + fVar104) * fStack_136c -
                                 (fVar154 + fVar102) * fStack_118c) * local_13a4.m128[3];
                  local_1318._0_4_ = fVar173 + fVar165 + auVar69._0_4_;
                  local_1318._4_4_ = fVar174 + fVar167 + auVar69._4_4_;
                  local_1318._8_4_ = fStack_12c0 + fStack_12d0 + auVar69._8_4_;
                  local_1318._12_4_ = fStack_12bc + fStack_12cc + auVar69._12_4_;
                  auVar92._8_4_ = fStack_12c0;
                  auVar92._0_8_ = local_12c8;
                  auVar92._12_4_ = fStack_12bc;
                  auVar24._4_4_ = fVar167;
                  auVar24._0_4_ = fVar165;
                  auVar24._8_4_ = fStack_12d0;
                  auVar24._12_4_ = fStack_12cc;
                  auVar149 = minps(auVar92,auVar24);
                  auVar149 = minps(auVar149,auVar69);
                  auVar201._8_4_ = fStack_12c0;
                  auVar201._0_8_ = local_12c8;
                  auVar201._12_4_ = fStack_12bc;
                  local_12d8 = CONCAT44(fVar167,fVar165);
                  auVar25._4_4_ = fVar167;
                  auVar25._0_4_ = fVar165;
                  auVar25._8_4_ = fStack_12d0;
                  auVar25._12_4_ = fStack_12cc;
                  auVar148 = maxps(auVar201,auVar25);
                  auVar148 = maxps(auVar148,auVar69);
                  local_11b8 = ABS(local_1318._0_4_);
                  fStack_11b4 = ABS(local_1318._4_4_);
                  fStack_11b0 = ABS(local_1318._8_4_);
                  fStack_11ac = ABS(local_1318._12_4_);
                  auVar202._0_4_ =
                       -(uint)(auVar148._0_4_ <= local_11b8 * 1.1920929e-07 ||
                              -(local_11b8 * 1.1920929e-07) <= auVar149._0_4_) & local_1008;
                  auVar202._4_4_ =
                       -(uint)(auVar148._4_4_ <= fStack_11b4 * 1.1920929e-07 ||
                              -(fStack_11b4 * 1.1920929e-07) <= auVar149._4_4_) & uStack_1004;
                  auVar202._8_4_ =
                       -(uint)(auVar148._8_4_ <= fStack_11b0 * 1.1920929e-07 ||
                              -(fStack_11b0 * 1.1920929e-07) <= auVar149._8_4_) & uStack_1000;
                  auVar202._12_4_ =
                       -(uint)(auVar148._12_4_ <= fStack_11ac * 1.1920929e-07 ||
                              -(fStack_11ac * 1.1920929e-07) <= auVar149._12_4_) & uStack_ffc;
                  iVar45 = movmskps((int)uVar49,auVar202);
                  uVar49 = local_10a8;
                  if (iVar45 != 0) {
                    auVar144._0_4_ = local_1178 * fVar175 - fVar164 * fVar136;
                    auVar144._4_4_ = fStack_1174 * fVar176 - fVar166 * fVar146;
                    auVar144._8_4_ = fStack_1170 * fVar177 - fStack_1160 * fVar155;
                    auVar144._12_4_ = fStack_116c * fVar178 - fStack_115c * fVar158;
                    auVar152._0_4_ = fVar136 * local_11a8 - fVar175 * (float)local_1198._0_4_;
                    auVar152._4_4_ = fVar146 * fStack_11a4 - fVar176 * (float)local_1198._4_4_;
                    auVar152._8_4_ = fVar155 * fStack_11a0 - fVar177 * fStack_1190;
                    auVar152._12_4_ = fVar158 * fStack_119c - fVar178 * fStack_118c;
                    auVar70._4_4_ =
                         -(uint)(ABS(fVar166 * fVar146) < ABS(fVar176 * (float)local_1198._4_4_));
                    auVar70._0_4_ =
                         -(uint)(ABS(fVar164 * fVar136) < ABS(fVar175 * (float)local_1198._0_4_));
                    auVar70._8_4_ = -(uint)(ABS(fStack_1160 * fVar155) < ABS(fVar177 * fStack_1190))
                    ;
                    auVar70._12_4_ =
                         -(uint)(ABS(fStack_115c * fVar158) < ABS(fVar178 * fStack_118c));
                    local_1238 = blendvps(auVar152,auVar144,auVar70);
                    auVar181._0_4_ = fVar175 * (float)local_1378._0_4_ - fVar159 * local_11a8;
                    auVar181._4_4_ = fVar176 * (float)local_1378._4_4_ - fVar160 * fStack_11a4;
                    auVar181._8_4_ = fVar177 * fStack_1370 - fStack_1180 * fStack_11a0;
                    auVar181._12_4_ = fVar178 * fStack_136c - fStack_117c * fStack_119c;
                    auVar71._4_4_ = -(uint)(ABS(fVar145 * fVar176) < ABS(fVar160 * fStack_11a4));
                    auVar71._0_4_ = -(uint)(ABS(fVar112 * fVar175) < ABS(fVar159 * local_11a8));
                    auVar71._8_4_ = -(uint)(ABS(fVar147 * fVar177) < ABS(fStack_1180 * fStack_11a0))
                    ;
                    auVar71._12_4_ =
                         -(uint)(ABS(fVar156 * fVar178) < ABS(fStack_117c * fStack_119c));
                    auVar28._4_4_ = fVar166 * fVar160 - fVar145 * fVar176;
                    auVar28._0_4_ = fVar164 * fVar159 - fVar112 * fVar175;
                    auVar28._8_4_ = fStack_1160 * fStack_1180 - fVar147 * fVar177;
                    auVar28._12_4_ = fStack_115c * fStack_117c - fVar156 * fVar178;
                    local_1228 = blendvps(auVar181,auVar28,auVar71);
                    auVar172._0_4_ = fVar112 * fVar136 - local_1178 * fVar159;
                    auVar172._4_4_ = fVar145 * fVar146 - fStack_1174 * fVar160;
                    auVar172._8_4_ = fVar147 * fVar155 - fStack_1170 * fStack_1180;
                    auVar172._12_4_ = fVar156 * fVar158 - fStack_116c * fStack_117c;
                    auVar135._0_4_ =
                         fVar159 * (float)local_1198._0_4_ - fVar136 * (float)local_1378._0_4_;
                    auVar135._4_4_ =
                         fVar160 * (float)local_1198._4_4_ - fVar146 * (float)local_1378._4_4_;
                    auVar135._8_4_ = fStack_1180 * fStack_1190 - fVar155 * fStack_1370;
                    auVar135._12_4_ = fStack_117c * fStack_118c - fVar158 * fStack_136c;
                    auVar72._4_4_ =
                         -(uint)(ABS(fStack_1174 * fVar160) < ABS(fVar146 * (float)local_1378._4_4_)
                                );
                    auVar72._0_4_ =
                         -(uint)(ABS(local_1178 * fVar159) < ABS(fVar136 * (float)local_1378._0_4_))
                    ;
                    auVar72._8_4_ =
                         -(uint)(ABS(fStack_1170 * fStack_1180) < ABS(fVar155 * fStack_1370));
                    auVar72._12_4_ =
                         -(uint)(ABS(fStack_116c * fStack_117c) < ABS(fVar158 * fStack_136c));
                    local_1218 = blendvps(auVar135,auVar172,auVar72);
                    auVar93._0_4_ =
                         fVar157 * local_1228._0_4_ + local_13a4.m128[3] * local_1218._0_4_;
                    auVar93._4_4_ =
                         fVar157 * local_1228._4_4_ + local_13a4.m128[3] * local_1218._4_4_;
                    auVar93._8_4_ =
                         fVar157 * local_1228._8_4_ + local_13a4.m128[3] * local_1218._8_4_;
                    auVar93._12_4_ =
                         fVar157 * local_1228._12_4_ + local_13a4.m128[3] * local_1218._12_4_;
                    fVar154 = fVar153 * local_1238._0_4_ + auVar93._0_4_;
                    fVar168 = fVar153 * local_1238._4_4_ + auVar93._4_4_;
                    fVar198 = fVar153 * local_1238._8_4_ + auVar93._8_4_;
                    fVar153 = fVar153 * local_1238._12_4_ + auVar93._12_4_;
                    auVar192._0_4_ = fVar154 + fVar154;
                    auVar192._4_4_ = fVar168 + fVar168;
                    auVar192._8_4_ = fVar198 + fVar198;
                    auVar192._12_4_ = fVar153 + fVar153;
                    fVar157 = (float)local_1138 * local_1238._0_4_ +
                              local_1148 * local_1228._0_4_ + local_1158 * local_1218._0_4_;
                    fVar82 = local_1138._4_4_ * local_1238._4_4_ +
                             fStack_1144 * local_1228._4_4_ + fStack_1154 * local_1218._4_4_;
                    fVar103 = fStack_1130 * local_1238._8_4_ +
                              fStack_1140 * local_1228._8_4_ + fStack_1150 * local_1218._8_4_;
                    fVar113 = fStack_112c * local_1238._12_4_ +
                              fStack_113c * local_1228._12_4_ + fStack_114c * local_1218._12_4_;
                    auVar149 = rcpps(auVar93,auVar192);
                    fVar154 = auVar149._0_4_;
                    fVar168 = auVar149._4_4_;
                    fVar198 = auVar149._8_4_;
                    fVar153 = auVar149._12_4_;
                    local_1248[0] =
                         ((1.0 - auVar192._0_4_ * fVar154) * fVar154 + fVar154) *
                         (fVar157 + fVar157);
                    local_1248[1] =
                         ((1.0 - auVar192._4_4_ * fVar168) * fVar168 + fVar168) * (fVar82 + fVar82);
                    local_1248[2] =
                         ((1.0 - auVar192._8_4_ * fVar198) * fVar198 + fVar198) *
                         (fVar103 + fVar103);
                    local_1248[3] =
                         ((1.0 - auVar192._12_4_ * fVar153) * fVar153 + fVar153) *
                         (fVar113 + fVar113);
                    fVar154 = (ray->super_RayK<1>).tfar;
                    fVar168 = (ray->super_RayK<1>).org.field_0.m128[3];
                    auVar193._0_4_ =
                         (int)((uint)(auVar192._0_4_ != 0.0 &&
                                     (local_1248[0] <= fVar154 && fVar168 <= local_1248[0])) *
                              -0x80000000) >> 0x1f;
                    auVar193._4_4_ =
                         (int)((uint)(auVar192._4_4_ != 0.0 &&
                                     (local_1248[1] <= fVar154 && fVar168 <= local_1248[1])) *
                              -0x80000000) >> 0x1f;
                    auVar193._8_4_ =
                         (int)((uint)(auVar192._8_4_ != 0.0 &&
                                     (local_1248[2] <= fVar154 && fVar168 <= local_1248[2])) *
                              -0x80000000) >> 0x1f;
                    auVar193._12_4_ =
                         (int)((uint)(auVar192._12_4_ != 0.0 &&
                                     (local_1248[3] <= fVar154 && fVar168 <= local_1248[3])) *
                              -0x80000000) >> 0x1f;
                    auVar194 = auVar193 & auVar202;
                    iVar45 = movmskps(iVar45,auVar194);
                    if (iVar45 != 0) {
                      local_1298 = local_1318;
                      local_1288 = &local_13b1;
                      local_1278 = auVar194;
                      fVar154 = (float)(int)(*(ushort *)(uVar48 + 8 + lVar52) - 1);
                      auVar149 = rcpss(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
                      fStack_12ac = (2.0 - fVar154 * auVar149._0_4_) * auVar149._0_4_;
                      fVar154 = (float)(int)(*(ushort *)(uVar48 + 10 + lVar52) - 1);
                      auVar149 = rcpss(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154));
                      fVar154 = (2.0 - fVar154 * auVar149._0_4_) * auVar149._0_4_;
                      local_12b8._0_4_ =
                           fStack_12ac *
                           ((float)(int)local_11f8._0_4_ * local_1318._0_4_ +
                           (local_1318._0_4_ - fVar173));
                      local_12b8._4_4_ =
                           fStack_12ac *
                           ((float)(local_11f8._0_4_ + 1) * local_1318._4_4_ +
                           (local_1318._4_4_ - fVar174));
                      fStack_12b0 = fStack_12ac *
                                    ((float)(local_11f8._0_4_ + 1) * local_1318._8_4_ +
                                    (local_1318._8_4_ - fStack_12c0));
                      fStack_12ac = fStack_12ac *
                                    ((float)(int)local_11f8._0_4_ * local_1318._12_4_ +
                                    (local_1318._12_4_ - fStack_12bc));
                      auVar124._0_4_ =
                           (float)(int)local_1208._0_4_ * local_1318._0_4_ +
                           (local_1318._0_4_ - fVar165);
                      auVar124._4_4_ =
                           (float)(int)local_1208._0_4_ * local_1318._4_4_ +
                           (local_1318._4_4_ - fVar167);
                      auVar124._8_4_ =
                           (float)(local_1208._0_4_ + 1) * local_1318._8_4_ +
                           (local_1318._8_4_ - fStack_12d0);
                      auVar124._12_4_ =
                           (float)(local_1208._0_4_ + 1) * local_1318._12_4_ +
                           (local_1318._12_4_ - fStack_12cc);
                      local_12a8._0_4_ = fVar154 * auVar124._0_4_;
                      local_12a8._4_4_ = fVar154 * auVar124._4_4_;
                      fStack_12a0 = fVar154 * auVar124._8_4_;
                      fStack_129c = fVar154 * auVar124._12_4_;
                      pGVar12 = (context->scene->geometries).items[uVar36].ptr;
                      uVar37 = (ray->super_RayK<1>).mask;
                      if ((pGVar12->mask & uVar37) != 0) {
                        auVar149 = rcpps(auVar124,local_1318);
                        fVar154 = auVar149._0_4_;
                        fVar168 = auVar149._4_4_;
                        fVar198 = auVar149._8_4_;
                        fVar153 = auVar149._12_4_;
                        fVar154 = (float)(-(uint)(1e-18 <= local_11b8) &
                                         (uint)(((float)DAT_01feca10 - local_1318._0_4_ * fVar154) *
                                                fVar154 + fVar154));
                        fVar168 = (float)(-(uint)(1e-18 <= fStack_11b4) &
                                         (uint)((DAT_01feca10._4_4_ - local_1318._4_4_ * fVar168) *
                                                fVar168 + fVar168));
                        fVar198 = (float)(-(uint)(1e-18 <= fStack_11b0) &
                                         (uint)((DAT_01feca10._8_4_ - local_1318._8_4_ * fVar198) *
                                                fVar198 + fVar198));
                        fVar153 = (float)(-(uint)(1e-18 <= fStack_11ac) &
                                         (uint)((DAT_01feca10._12_4_ - local_1318._12_4_ * fVar153)
                                                * fVar153 + fVar153));
                        auVar94._0_4_ = (float)local_12b8._0_4_ * fVar154;
                        auVar94._4_4_ = (float)local_12b8._4_4_ * fVar168;
                        auVar94._8_4_ = fStack_12b0 * fVar198;
                        auVar94._12_4_ = fStack_12ac * fVar153;
                        local_1268 = minps(auVar94,_DAT_01feca10);
                        auVar110._0_4_ = (float)local_12a8._0_4_ * fVar154;
                        auVar110._4_4_ = (float)local_12a8._4_4_ * fVar168;
                        auVar110._8_4_ = fStack_12a0 * fVar198;
                        auVar110._12_4_ = fStack_129c * fVar153;
                        local_1258 = minps(auVar110,_DAT_01feca10);
                        auVar31._4_4_ = local_1248[1];
                        auVar31._0_4_ = local_1248[0];
                        auVar31._8_4_ = local_1248[2];
                        auVar31._12_4_ = local_1248[3];
                        auVar148 = blendvps(_DAT_01feb9f0,auVar31,auVar194);
                        local_1358 = auVar194;
                        auVar125._4_4_ = auVar148._0_4_;
                        auVar125._0_4_ = auVar148._4_4_;
                        auVar125._8_4_ = auVar148._12_4_;
                        auVar125._12_4_ = auVar148._8_4_;
                        auVar149 = minps(auVar125,auVar148);
                        auVar95._0_8_ = auVar149._8_8_;
                        auVar95._8_4_ = auVar149._0_4_;
                        auVar95._12_4_ = auVar149._4_4_;
                        auVar149 = minps(auVar95,auVar149);
                        auVar96._0_8_ =
                             CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) & auVar194._4_4_,
                                      -(uint)(auVar149._0_4_ == auVar148._0_4_) & auVar194._0_4_);
                        auVar96._8_4_ = -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar194._8_4_;
                        auVar96._12_4_ =
                             -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar194._12_4_;
                        iVar45 = movmskps(uVar37,auVar96);
                        if (iVar45 != 0) {
                          auVar194._8_4_ = auVar96._8_4_;
                          auVar194._0_8_ = auVar96._0_8_;
                          auVar194._12_4_ = auVar96._12_4_;
                        }
                        uVar37 = movmskps(iVar45,auVar194);
                        lVar38 = 0;
                        if (uVar37 != 0) {
                          for (; (uVar37 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                          }
                        }
                        pRVar14 = context->args;
                        if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar154 = *(float *)(local_1268 + lVar38 * 4);
                          fVar168 = local_1248[lVar38 + -4];
                          fVar198 = *(float *)(local_1238 + lVar38 * 4);
                          fVar153 = *(float *)(local_1228 + lVar38 * 4);
                          fVar157 = *(float *)(local_1218 + lVar38 * 4);
                          (ray->super_RayK<1>).tfar = local_1248[lVar38];
                          (ray->Ng).field_0.field_0.x = fVar198;
                          (ray->Ng).field_0.field_0.y = fVar153;
                          (ray->Ng).field_0.field_0.z = fVar157;
                          ray->u = fVar154;
                          ray->v = fVar168;
                          ray->primID = (uint)local_1380;
                          ray->geomID = uVar36;
                          pRVar15 = context->user;
                          ray->instID[0] = pRVar15->instID[0];
                          ray->instPrimID[0] = pRVar15->instPrimID[0];
                        }
                        else {
                          pRVar15 = context->user;
                          do {
                            local_12fc = *(undefined4 *)(local_1268 + lVar38 * 4);
                            local_12f8 = local_1248[lVar38 + -4];
                            local_1368._0_4_ = (ray->super_RayK<1>).tfar;
                            (ray->super_RayK<1>).tfar = local_1248[lVar38];
                            local_1308 = *(float *)(local_1238 + lVar38 * 4);
                            local_1304 = *(undefined4 *)(local_1228 + lVar38 * 4);
                            local_1300 = *(undefined4 *)(local_1218 + lVar38 * 4);
                            local_12f4 = (int)local_1380;
                            local_12f0 = uVar36;
                            local_12ec = pRVar15->instID[0];
                            local_12e8 = pRVar15->instPrimID[0];
                            local_13a4.m128[0] = -NAN;
                            local_1348.valid = (int *)&local_13a4;
                            local_1348.geometryUserPtr = pGVar12->userPtr;
                            local_1348.context = pRVar15;
                            local_1348.ray = (RTCRayN *)ray;
                            local_1348.hit = (RTCHitN *)&local_1308;
                            local_1348.N = 1;
                            if ((pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                               ((*pGVar12->intersectionFilterN)(&local_1348),
                               context = (RayQueryContext *)local_13a4._4_8_,
                               *(float *)local_1348.valid != 0.0)) {
                              if (pRVar14->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar12->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar14->filter)(&local_1348);
                                  context = (RayQueryContext *)local_13a4._4_8_;
                                }
                                if (*(float *)local_1348.valid == 0.0) goto LAB_00e97521;
                              }
                              *(float *)((long)local_1348.ray + 0x30) = *(float *)local_1348.hit;
                              *(float *)((long)local_1348.ray + 0x34) =
                                   *(float *)(local_1348.hit + 4);
                              *(float *)((long)local_1348.ray + 0x38) =
                                   *(float *)(local_1348.hit + 8);
                              *(float *)((long)local_1348.ray + 0x3c) =
                                   *(float *)(local_1348.hit + 0xc);
                              *(float *)((long)local_1348.ray + 0x40) =
                                   *(float *)(local_1348.hit + 0x10);
                              *(float *)((long)local_1348.ray + 0x44) =
                                   *(float *)(local_1348.hit + 0x14);
                              *(float *)((long)local_1348.ray + 0x48) =
                                   *(float *)(local_1348.hit + 0x18);
                              *(float *)((long)local_1348.ray + 0x4c) =
                                   *(float *)(local_1348.hit + 0x1c);
                              auVar43 = (undefined1  [8])
                                        (ulong)(uint)*(float *)(local_1348.hit + 0x20);
                              *(float *)((long)local_1348.ray + 0x50) =
                                   *(float *)(local_1348.hit + 0x20);
                              paVar39 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.ray;
                            }
                            else {
LAB_00e97521:
                              (ray->super_RayK<1>).tfar = (float)local_1368._0_4_;
                              paVar39 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_1348.valid;
                            }
                            *(undefined4 *)(local_1358 + lVar38 * 4) = 0;
                            fVar154 = (ray->super_RayK<1>).tfar;
                            auVar33._4_4_ = local_1248[1];
                            auVar33._0_4_ = local_1248[0];
                            auVar33._8_4_ = local_1248[2];
                            auVar33._12_4_ = local_1248[3];
                            auVar74._0_4_ = -(uint)(local_1248[0] <= fVar154) & local_1358._0_4_;
                            auVar74._4_4_ = -(uint)(local_1248[1] <= fVar154) & local_1358._4_4_;
                            auVar74._8_4_ = -(uint)(local_1248[2] <= fVar154) & local_1358._8_4_;
                            auVar74._12_4_ = -(uint)(local_1248[3] <= fVar154) & local_1358._12_4_;
                            local_1358 = auVar74;
                            iVar45 = movmskps((int)paVar39,auVar74);
                            if (iVar45 != 0) {
                              auVar148 = blendvps(_DAT_01feb9f0,auVar33,auVar74);
                              auVar127._4_4_ = auVar148._0_4_;
                              auVar127._0_4_ = auVar148._4_4_;
                              auVar127._8_4_ = auVar148._12_4_;
                              auVar127._12_4_ = auVar148._8_4_;
                              auVar149 = minps(auVar127,auVar148);
                              auVar99._0_8_ = auVar149._8_8_;
                              auVar99._8_4_ = auVar149._0_4_;
                              auVar99._12_4_ = auVar149._4_4_;
                              auVar149 = minps(auVar99,auVar149);
                              auVar100._0_8_ =
                                   CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) &
                                            auVar74._4_4_,
                                            -(uint)(auVar149._0_4_ == auVar148._0_4_) &
                                            auVar74._0_4_);
                              auVar100._8_4_ =
                                   -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar74._8_4_;
                              auVar100._12_4_ =
                                   -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar74._12_4_;
                              iVar42 = movmskps(SUB84(auVar43,0),auVar100);
                              if (iVar42 != 0) {
                                auVar74._8_4_ = auVar100._8_4_;
                                auVar74._0_8_ = auVar100._0_8_;
                                auVar74._12_4_ = auVar100._12_4_;
                              }
                              uVar35 = movmskps(iVar42,auVar74);
                              auVar43 = (undefined1  [8])
                                        CONCAT44((int)((ulong)auVar43 >> 0x20),uVar35);
                              lVar38 = 0;
                              if (auVar43 != (undefined1  [8])0x0) {
                                for (; ((ulong)auVar43 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                                }
                              }
                            }
                            uVar49 = local_10a8;
                          } while ((char)iVar45 != '\0');
                        }
                      }
                    }
                  }
                }
                local_1090 = local_1090 & local_1090 - 1;
              } while (local_1090 != 0);
            }
            local_10b8 = local_10b8 + 1;
            fVar154 = local_ff8;
            fVar168 = fStack_ff4;
            fVar198 = fStack_ff0;
            fVar153 = fStack_fec;
          } while (local_10b8 != local_10f0);
        }
        local_11d8._4_4_ = (ray->super_RayK<1>).tfar;
        local_11d8._0_4_ = local_11d8._4_4_;
        fStack_11d0 = (float)local_11d8._4_4_;
        fStack_11cc = (float)local_11d8._4_4_;
        auVar149 = local_1078;
        auVar148 = _local_1088;
        fVar157 = local_11e8;
        fVar82 = fStack_11e4;
        fVar103 = fStack_11e0;
        fVar113 = fStack_11dc;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }